

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglChooseConfigTests.cpp
# Opt level: O2

IterateResult __thiscall deqp::egl::ChooseConfigSimpleCase::iterate(ChooseConfigSimpleCase *this)

{
  vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_> attributes;
  _Vector_base<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
  local_28;
  pair<unsigned_int,_int> local_10;
  
  tcu::TestContext::setTestResult
            ((this->super_ChooseConfigCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
             QP_TEST_RESULT_PASS,"Pass");
  local_28._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_28._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_28._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_10.second = getValue(this,this->m_attribute);
  local_10.first = this->m_attribute;
  std::vector<std::pair<unsigned_int,int>,std::allocator<std::pair<unsigned_int,int>>>::
  emplace_back<std::pair<unsigned_int,int>>
            ((vector<std::pair<unsigned_int,int>,std::allocator<std::pair<unsigned_int,int>>> *)
             &local_28,&local_10);
  ChooseConfigCase::fillDontCare
            (&this->super_ChooseConfigCase,
             (vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_> *
             )&local_28);
  ChooseConfigCase::executeTest
            (&this->super_ChooseConfigCase,
             (vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_> *
             )&local_28,(this->super_ChooseConfigCase).m_checkOrder);
  std::_Vector_base<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>::
  ~_Vector_base(&local_28);
  return STOP;
}

Assistant:

TestCase::IterateResult iterate (void)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

		std::vector<std::pair<EGLenum, EGLint> > attributes;
		attributes.push_back(std::pair<EGLenum, EGLint>(m_attribute, getValue(m_attribute)));

		fillDontCare(attributes);
		executeTest(attributes, m_checkOrder);

		return STOP;
	}